

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldLabel_Test::TestBody
          (DescriptorTest_FieldLabel_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_348;
  AssertHelper local_328;
  Message local_320;
  bool local_311;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_250;
  Message local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1c0;
  Message local_1b8;
  bool local_1a9;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_;
  Message local_b8;
  Label local_b0 [2];
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_3;
  Message local_90;
  Label local_88 [2];
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  Label local_60 [2];
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  Label local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  DescriptorTest_FieldLabel_Test *this_local;
  
  local_28[1] = 2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28[0] = FieldDescriptor::label((this->super_DescriptorTest).foo_);
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::FieldDescriptorLite::Label,_google::protobuf::internal::FieldDescriptorLite::Label,_nullptr>
            ((EqHelper *)local_20,"FieldDescriptor::LABEL_REQUIRED","foo_->label()",local_28 + 1,
             local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4ca,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_60[1] = 1;
  local_60[0] = FieldDescriptor::label((this->super_DescriptorTest).bar_);
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::FieldDescriptorLite::Label,_google::protobuf::internal::FieldDescriptorLite::Label,_nullptr>
            ((EqHelper *)local_58,"FieldDescriptor::LABEL_OPTIONAL","bar_->label()",local_60 + 1,
             local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4cb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_88[1] = 3;
  local_88[0] = FieldDescriptor::label((this->super_DescriptorTest).baz_);
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::FieldDescriptorLite::Label,_google::protobuf::internal::FieldDescriptorLite::Label,_nullptr>
            ((EqHelper *)local_80,"FieldDescriptor::LABEL_REPEATED","baz_->label()",local_88 + 1,
             local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4cc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b0[1] = 1;
  local_b0[0] = FieldDescriptor::label((this->super_DescriptorTest).moo_);
  testing::internal::EqHelper::
  Compare<google::protobuf::internal::FieldDescriptorLite::Label,_google::protobuf::internal::FieldDescriptorLite::Label,_nullptr>
            ((EqHelper *)local_a8,"FieldDescriptor::LABEL_OPTIONAL","moo_->label()",local_b0 + 1,
             local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4cd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d1 = FieldDescriptor::is_required((this->super_DescriptorTest).foo_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_d0,
               (AssertionResult *)"foo_->is_required()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4cf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_119 = FieldDescriptor::is_optional((this->super_DescriptorTest).foo_);
  local_119 = !local_119;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_118,
               (AssertionResult *)"foo_->is_optional()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_161 = FieldDescriptor::is_repeated((this->super_DescriptorTest).foo_);
  local_161 = !local_161;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_160,
               (AssertionResult *)"foo_->is_repeated()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_1a9 = FieldDescriptor::is_required((this->super_DescriptorTest).bar_);
  local_1a9 = !local_1a9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a8,&local_1a9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_1a8,
               (AssertionResult *)"bar_->is_required()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1f1 = FieldDescriptor::is_optional((this->super_DescriptorTest).bar_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_1f0,
               (AssertionResult *)"bar_->is_optional()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_239 = FieldDescriptor::is_repeated((this->super_DescriptorTest).bar_);
  local_239 = !local_239;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_238,&local_239,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_238,
               (AssertionResult *)"bar_->is_repeated()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_281 = FieldDescriptor::is_required((this->super_DescriptorTest).baz_);
  local_281 = !local_281;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_280,&local_281,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_280,
               (AssertionResult *)"baz_->is_required()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
  local_2c9 = FieldDescriptor::is_optional((this->super_DescriptorTest).baz_);
  local_2c9 = !local_2c9;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_2c8,
               (AssertionResult *)"baz_->is_optional()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_311 = FieldDescriptor::is_repeated((this->super_DescriptorTest).baz_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_310,&local_311,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_348,(internal *)local_310,(AssertionResult *)"baz_->is_repeated()","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x4d9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  return;
}

Assistant:

TEST_F(DescriptorTest, FieldLabel) {
  EXPECT_EQ(FieldDescriptor::LABEL_REQUIRED, foo_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, bar_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_REPEATED, baz_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, moo_->label());

  EXPECT_TRUE(foo_->is_required());
  EXPECT_FALSE(foo_->is_optional());
  EXPECT_FALSE(foo_->is_repeated());

  EXPECT_FALSE(bar_->is_required());
  EXPECT_TRUE(bar_->is_optional());
  EXPECT_FALSE(bar_->is_repeated());

  EXPECT_FALSE(baz_->is_required());
  EXPECT_FALSE(baz_->is_optional());
  EXPECT_TRUE(baz_->is_repeated());
}